

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DNATrie.cpp
# Opt level: O0

void DNA::fromCStr(Base *dest,size_t dest_size,char *src)

{
  bool bVar1;
  char *local_20;
  char *src_local;
  size_t dest_size_local;
  Base *dest_local;
  
  local_20 = src;
  src_local = (char *)dest_size;
  dest_size_local = (size_t)dest;
  while( true ) {
    bVar1 = false;
    if (src_local != (char *)0x0) {
      bVar1 = *local_20 != '\0';
    }
    if (!bVar1) break;
    switch(*local_20) {
    case 'A':
    case 'a':
      *(undefined4 *)dest_size_local = 0;
      dest_size_local = dest_size_local + 4;
      break;
    default:
      break;
    case 'C':
    case 'c':
      *(undefined4 *)dest_size_local = 1;
      dest_size_local = dest_size_local + 4;
      break;
    case 'G':
    case 'g':
      *(undefined4 *)dest_size_local = 2;
      dest_size_local = dest_size_local + 4;
      break;
    case 'T':
    case 't':
      *(undefined4 *)dest_size_local = 3;
      dest_size_local = dest_size_local + 4;
    }
    local_20 = local_20 + 1;
    src_local = src_local + -1;
  }
  return;
}

Assistant:

void DNA::fromCStr(DNA::Base* dest, size_t dest_size, const char* src)
{
    while (dest_size-- && *src) {
        switch (*src) {
            case 'a':
            case 'A':
                *dest++ = A;
                break;
            case 'c':
            case 'C':
                *dest++ = C;
                break;
            case 'g':
            case 'G':
                *dest++ = G;
                break;
            case 't':
            case 'T':
                *dest++ = T;
                break;
            default:
                // Ignore non DNA chars
                break;
        }
        ++src;
    }
}